

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hopDfs.c
# Opt level: O1

Hop_Obj_t * Hop_Compose(Hop_Man_t *p,Hop_Obj_t *pRoot,Hop_Obj_t *pFunc,int iVar)

{
  Hop_Obj_t *pHVar1;
  
  if (iVar < p->nObjs[2]) {
    if ((iVar < 0) || (p->vPis->nSize <= iVar)) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                    ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
    }
    pHVar1 = (Hop_Obj_t *)((ulong)pRoot & 0xfffffffffffffffe);
    Hop_Compose_rec(p,pHVar1,pFunc,(Hop_Obj_t *)p->vPis->pArray[(uint)iVar]);
    Hop_ConeUnmark_rec(pHVar1);
    pHVar1 = (Hop_Obj_t *)((ulong)((uint)pRoot & 1) ^ (ulong)(pHVar1->field_0).pData);
  }
  else {
    pHVar1 = (Hop_Obj_t *)0x0;
    printf("Hop_Compose(): The PI variable %d is not defined.\n",(ulong)(uint)iVar);
  }
  return pHVar1;
}

Assistant:

Hop_Obj_t * Hop_Compose( Hop_Man_t * p, Hop_Obj_t * pRoot, Hop_Obj_t * pFunc, int iVar )
{
    // quit if the PI variable is not defined
    if ( iVar >= Hop_ManPiNum(p) )
    {
        printf( "Hop_Compose(): The PI variable %d is not defined.\n", iVar );
        return NULL;
    }
    // recursively perform composition
    Hop_Compose_rec( p, Hop_Regular(pRoot), pFunc, Hop_ManPi(p, iVar) );
    // clear the markings
    Hop_ConeUnmark_rec( Hop_Regular(pRoot) );
    return Hop_NotCond( (Hop_Obj_t *)Hop_Regular(pRoot)->pData, Hop_IsComplement(pRoot) );
}